

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QDate __thiscall QDate::addYears(QDate *this,int nyears)

{
  int iVar1;
  QDate QVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  YearMonthDay YVar6;
  YearMonthDay parts;
  
  if (0xfffffe92c1eb868b < this->jd - 0xb69f248055U) {
    YVar6 = QGregorianCalendar::partsFromJulian(this->jd);
    uVar4 = YVar6._0_8_ & 0xffffffff00000000;
    if (uVar4 != 0x8000000000000000) {
      iVar3 = YVar6.year + nyears;
      iVar1 = (uint)(0 < nyears) * 2 + -1;
      iVar5 = 0;
      if (iVar3 < 1 == 0 < YVar6.year) {
        iVar5 = iVar1;
      }
      if (iVar3 == 0) {
        iVar5 = iVar1;
      }
      parts._0_8_ = uVar4 | (uint)(iVar5 + iVar3);
      parts.day = YVar6.day;
      QVar2 = fixedDate(parts);
      return (QDate)QVar2.jd;
    }
  }
  return (QDate)-0x8000000000000000;
}

Assistant:

QDate QDate::addYears(int nyears) const
{
    if (isNull())
        return QDate();

    auto parts = QGregorianCalendar::partsFromJulian(jd);
    if (!parts.isValid())
        return QDate();

    int old_y = parts.year;
    parts.year += nyears;

    // If we just crossed (or hit) a missing year zero, adjust year by ±1:
    if ((old_y > 0) != (parts.year > 0) || !parts.year)
        parts.year += nyears > 0 ? +1 : -1;

    return fixedDate(parts);
}